

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O1

int saisxx_private::
    computeBWT<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> T,
              __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,
              __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> C,
              __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> B,long n,long k)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar7;
  
  if (C._M_current == B._M_current) {
    if (0 < k) {
      memset(C._M_current,0,k * 8);
    }
    if (0 < n) {
      lVar4 = 0;
      do {
        C._M_current[T._M_current[lVar4]] = C._M_current[T._M_current[lVar4]] + 1;
        lVar4 = lVar4 + 1;
      } while (n != lVar4);
    }
  }
  if (0 < k) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar7 = C._M_current[lVar5];
      B._M_current[lVar5] = lVar4;
      lVar5 = lVar5 + 1;
      lVar4 = lVar7 + lVar4;
    } while (k != lVar5);
  }
  uVar8 = T._M_current[n + -1];
  lVar4 = B._M_current[uVar8];
  lVar5 = n + -1;
  if ((1 < n) && (T._M_current[n + -2] < (long)uVar8)) {
    lVar5 = -n;
  }
  SA._M_current[lVar4] = lVar5;
  if (0 < n) {
    plVar6 = SA._M_current + lVar4 + 1;
    lVar4 = 0;
    do {
      uVar10 = SA._M_current[lVar4];
      if ((long)uVar10 < 1) {
        if (uVar10 != 0) {
          SA._M_current[lVar4] = ~uVar10;
        }
      }
      else {
        uVar1 = T._M_current[uVar10 - 1];
        SA._M_current[lVar4] = ~uVar1;
        if (uVar1 != uVar8) {
          B._M_current[uVar8] = (long)plVar6 - (long)SA._M_current >> 3;
          plVar6 = SA._M_current + B._M_current[uVar1];
          uVar8 = uVar1;
        }
        lVar5 = uVar10 - 1;
        if ((uVar10 != 1) && (T._M_current[uVar10 - 2] < (long)uVar8)) {
          lVar5 = -uVar10;
        }
        *plVar6 = lVar5;
        plVar6 = plVar6 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (n != lVar4);
  }
  if (C._M_current == B._M_current) {
    if (0 < k) {
      memset(C._M_current,0,k * 8);
    }
    if (0 < n) {
      lVar4 = 0;
      do {
        C._M_current[T._M_current[lVar4]] = C._M_current[T._M_current[lVar4]] + 1;
        lVar4 = lVar4 + 1;
      } while (n != lVar4);
    }
  }
  if (0 < k) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar4 = lVar4 + C._M_current[lVar5];
      B._M_current[lVar5] = lVar4;
      lVar5 = lVar5 + 1;
    } while (k != lVar5);
  }
  if (n < 1) {
    iVar3 = -1;
  }
  else {
    plVar6 = SA._M_current + *B._M_current;
    lVar5 = 0;
    lVar4 = -1;
    do {
      lVar7 = n + -1;
      uVar8 = SA._M_current[n + -1];
      if ((long)uVar8 < 1) {
        if (uVar8 != 0) {
          SA._M_current[n + -1] = ~uVar8;
          lVar7 = lVar4;
        }
      }
      else {
        lVar7 = T._M_current[uVar8 - 1];
        SA._M_current[n + -1] = lVar7;
        if (lVar7 != lVar5) {
          B._M_current[lVar5] = (long)plVar6 - (long)SA._M_current >> 3;
          plVar6 = SA._M_current + B._M_current[lVar7];
          lVar5 = lVar7;
        }
        uVar10 = uVar8 - 1;
        if ((uVar8 != 1) && (lVar5 < T._M_current[uVar8 - 2])) {
          uVar10 = ~T._M_current[uVar8 - 2];
        }
        plVar6[-1] = uVar10;
        plVar6 = plVar6 + -1;
        lVar7 = lVar4;
      }
      iVar3 = (int)lVar7;
      lVar9 = n + -1;
      bVar2 = 0 < n;
      lVar4 = lVar7;
      n = lVar9;
    } while (lVar9 != 0 && bVar2);
  }
  return iVar3;
}

Assistant:

int
computeBWT(string_type T, sarray_type SA, bucket_type C, bucket_type B,
           index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j, pidx = -1;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    if(0 < (j = SA[i])) {
      SA[i] = ~(c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    } else if(j != 0) {
      SA[i] = ~j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      SA[i] = (c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((0 < j) && (T[j - 1] > c1)) ? ~((index_type)T[j - 1]) : j;
    } else if(j != 0) {
      SA[i] = ~j;
    } else {
      pidx = i;
    }
  }
  return pidx;
}